

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ReturningSubqueryCorrelated(Walker *pWalker,Select *pSelect)

{
  SrcList *pSrc;
  int i;
  Select *pSelect_local;
  Walker *pWalker_local;
  
  i = 0;
  while( true ) {
    if (pSelect->pSrc->nSrc <= i) {
      return 0;
    }
    if (pSelect->pSrc->a[i].pSTab == (Table *)(pWalker->u).pNC) break;
    i = i + 1;
  }
  pSelect->selFlags = pSelect->selFlags | 0x20000000;
  pWalker->eCode = 1;
  return 0;
}

Assistant:

static int sqlite3ReturningSubqueryCorrelated(Walker *pWalker, Select *pSelect){
  int i;
  SrcList *pSrc;
  assert( pSelect!=0 );
  pSrc = pSelect->pSrc;
  assert( pSrc!=0 );
  for(i=0; i<pSrc->nSrc; i++){
    if( pSrc->a[i].pSTab==pWalker->u.pTab ){
      testcase( pSelect->selFlags & SF_Correlated );
      pSelect->selFlags |= SF_Correlated;
      pWalker->eCode = 1;
      break;
    }
  }
  return WRC_Continue;
}